

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::Image(Image *this,Image *im)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  void *__dest;
  size_t __size;
  
  lVar3 = im->width;
  this->width = lVar3;
  lVar4 = im->height;
  this->height = lVar4;
  bVar1 = im->has_alpha;
  this->has_alpha = bVar1;
  bVar2 = im->channel_width;
  this->channel_width = bVar2;
  this->max_value = im->max_value;
  __size = (ulong)(bVar2 >> 3) * ((ulong)bVar1 + 3) * lVar4 * lVar3;
  __dest = malloc(__size);
  (this->data).raw = __dest;
  memcpy(__dest,(im->data).raw,__size);
  return;
}

Assistant:

Image::Image(const Image& im)
    : width(im.width),
      height(im.height),
      has_alpha(im.has_alpha),
      channel_width(im.channel_width),
      max_value(im.max_value) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memcpy(this->data.raw, im.data.raw, num_bytes * sizeof(uint8_t));
}